

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O3

int Abc_NtkCrossCut(Abc_Ntk_t *pNtk)

{
  int *__s;
  Vec_Ptr_t *pVVar1;
  long lVar2;
  uint uVar3;
  int iVar4;
  int nCutSize;
  int nCutSizeMax;
  int local_30;
  uint local_2c;
  
  local_30 = 0;
  local_2c = 0;
  pVVar1 = pNtk->vObjs;
  iVar4 = pVVar1->nSize;
  if (0 < iVar4) {
    lVar2 = 0;
    do {
      if (pVVar1->pArray[lVar2] != (void *)0x0) {
        *(undefined8 *)((long)pVVar1->pArray[lVar2] + 0x40) = 0;
        pVVar1 = pNtk->vObjs;
      }
      lVar2 = lVar2 + 1;
      iVar4 = pVVar1->nSize;
    } while (lVar2 < iVar4);
  }
  if ((pNtk->vTravIds).pArray == (int *)0x0) {
    uVar3 = iVar4 + 500;
    if ((pNtk->vTravIds).nCap < (int)uVar3) {
      __s = (int *)malloc((long)(int)uVar3 << 2);
      (pNtk->vTravIds).pArray = __s;
      if (__s == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (pNtk->vTravIds).nCap = uVar3;
    }
    else {
      __s = (int *)0x0;
    }
    if (-500 < iVar4) {
      memset(__s,0,(ulong)uVar3 << 2);
    }
    (pNtk->vTravIds).nSize = uVar3;
  }
  iVar4 = pNtk->nTravIds;
  pNtk->nTravIds = iVar4 + 1;
  if (iVar4 < 0x3fffffff) {
    pVVar1 = pNtk->vCos;
    if (0 < pVVar1->nSize) {
      lVar2 = 0;
      do {
        Abc_NtkCrossCut_rec((Abc_Obj_t *)pVVar1->pArray[lVar2],&local_30,(int *)&local_2c);
        local_30 = local_30 + -1;
        lVar2 = lVar2 + 1;
        pVVar1 = pNtk->vCos;
      } while (lVar2 < pVVar1->nSize);
      if (local_30 != 0) {
        __assert_fail("nCutSize == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcUtil.c"
                      ,0x80c,"int Abc_NtkCrossCut(Abc_Ntk_t *)");
      }
    }
    uVar3 = local_2c;
    printf("Max cross cut size = %6d.  Ratio = %6.2f %%\n",
           ((double)(int)local_2c * 100.0) / (double)pNtk->nObjs,(ulong)local_2c);
    return uVar3;
  }
  __assert_fail("p->nTravIds < (1<<30)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                ,0x198,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
}

Assistant:

int Abc_NtkCrossCut( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pObj;
    int nCutSize = 0, nCutSizeMax = 0;
    int i;
    Abc_NtkCleanCopy( pNtk );
    Abc_NtkIncrementTravId( pNtk );
    Abc_NtkForEachCo( pNtk, pObj, i )
    {
        Abc_NtkCrossCut_rec( pObj, &nCutSize, &nCutSizeMax );
        nCutSize--;
    }
    assert( nCutSize == 0 );
    printf( "Max cross cut size = %6d.  Ratio = %6.2f %%\n", nCutSizeMax, 100.0 * nCutSizeMax/Abc_NtkObjNum(pNtk) );
    return nCutSizeMax;
}